

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O1

int XNVCTRLSetTargetStringAttribute
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,char *ptr
              )

{
  _XLockPtrs *p_Var1;
  XExtDisplayInfo *pXVar2;
  size_t sVar3;
  undefined1 *puVar4;
  int iVar5;
  uint uVar6;
  xnvCtrlSetStringAttributeReply rep;
  undefined1 local_50 [8];
  int local_48;
  
  pXVar2 = find_display(dpy);
  iVar5 = 0;
  if ((pXVar2 != (XExtDisplayInfo *)0x0) && (iVar5 = 0, pXVar2->codes != (XExtCodes *)0x0)) {
    sVar3 = strlen(ptr);
    iVar5 = (uint)sVar3 + 1;
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar4 = (undefined1 *)_XGetRequest(dpy,9,0x14);
    *puVar4 = (char)pXVar2->codes->major_opcode;
    puVar4[1] = 9;
    *(short *)(puVar4 + 6) = (short)target_type;
    *(short *)(puVar4 + 4) = (short)target_id;
    *(uint *)(puVar4 + 8) = display_mask;
    *(uint *)(puVar4 + 0xc) = attribute;
    uVar6 = ((uint)sVar3 & 0xfffffffc) + 4;
    *(short *)(puVar4 + 2) = *(short *)(puVar4 + 2) + (short)(uVar6 >> 2);
    *(int *)(puVar4 + 0x10) = iVar5;
    if (dpy->bufmax < dpy->bufptr + iVar5) {
      _XSend(dpy,ptr);
    }
    else {
      memcpy(dpy->bufptr,ptr,(long)iVar5);
      dpy->bufptr = dpy->bufptr + (int)uVar6;
    }
    iVar5 = _XReply(dpy,local_50,0,0);
    p_Var1 = dpy->lock_fns;
    if (iVar5 == 0) {
      if (p_Var1 != (_XLockPtrs *)0x0) {
        (*p_Var1->unlock_display)(dpy);
      }
      iVar5 = 0;
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
        iVar5 = 0;
      }
    }
    else {
      if (p_Var1 != (_XLockPtrs *)0x0) {
        (*p_Var1->unlock_display)(dpy);
      }
      iVar5 = local_48;
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
        iVar5 = local_48;
      }
    }
  }
  return iVar5;
}

Assistant:

Bool XNVCTRLSetTargetStringAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    char *ptr
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetStringAttributeReq *req;
    xnvCtrlSetStringAttributeReply rep;
    int size;
    Bool success;
    
    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    size = strlen(ptr)+1;

    LockDisplay (dpy);
    GetReq (nvCtrlSetStringAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetStringAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->length += ((size + 3) & ~3) >> 2;
    req->num_bytes = size;
    Data(dpy, ptr, size);
    
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    UnlockDisplay (dpy);
    SyncHandle ();
    
    success = rep.flags;
    return success;
}